

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

int str_byte(lua_State *L)

{
  ulong in_RAX;
  char *pcVar1;
  lua_Integer lVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint space;
  size_t l;
  ulong local_38;
  
  local_38 = in_RAX;
  pcVar1 = luaL_checklstring(L,1,&local_38);
  lVar2 = luaL_optinteger(L,2,1);
  uVar5 = (lVar2 >> 0x3f & local_38 + 1) + lVar2;
  space = 0;
  uVar3 = 0;
  if (0 < (long)uVar5) {
    uVar3 = uVar5;
  }
  lVar2 = luaL_optinteger(L,3,uVar3);
  uVar3 = (lVar2 >> 0x3f & local_38 + 1) + lVar2;
  if ((long)uVar3 < 1) {
    uVar3 = 0;
  }
  if ((long)uVar5 < 2) {
    uVar5 = 1;
  }
  if (local_38 <= uVar3) {
    uVar3 = local_38;
  }
  if (uVar5 <= uVar3) {
    uVar4 = (int)uVar3 - (int)uVar5;
    space = uVar4 + 1;
    if ((long)((long)(int)space + uVar5) <= (long)uVar3) {
      luaL_error(L,"string slice too long");
    }
    luaL_checkstack(L,space,"string slice too long");
    if (uVar4 < 0x7fffffff) {
      uVar3 = 1;
      if (1 < (int)space) {
        uVar3 = (ulong)space;
      }
      uVar6 = 0;
      do {
        lua_pushinteger(L,(ulong)(byte)pcVar1[uVar6 + (uVar5 - 1)]);
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
    }
  }
  return space;
}

Assistant:

static int str_byte (lua_State *L) {
  size_t l;
  const char *s = luaL_checklstring(L, 1, &l);
  ptrdiff_t posi = posrelat(luaL_optinteger(L, 2, 1), l);
  ptrdiff_t pose = posrelat(luaL_optinteger(L, 3, posi), l);
  int n, i;
  if (posi <= 0) posi = 1;
  if ((size_t)pose > l) pose = l;
  if (posi > pose) return 0;  /* empty interval; return no values */
  n = (int)(pose -  posi + 1);
  if (posi + n <= pose)  /* overflow? */
    luaL_error(L, "string slice too long");
  luaL_checkstack(L, n, "string slice too long");
  for (i=0; i<n; i++)
    lua_pushinteger(L, uchar(s[posi+i-1]));
  return n;
}